

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O0

gpu_object * gpu_object_find(uint32_t cid,uint32_t handle)

{
  gpu_object *local_20;
  gpu_object *obj;
  uint32_t handle_local;
  uint32_t cid_local;
  
  local_20 = gpu_objects;
  while( true ) {
    if (local_20 == (gpu_object *)0x0) {
      return (gpu_object *)0x0;
    }
    if ((local_20->cid == cid) && (local_20->handle == handle)) break;
    local_20 = local_20->next;
  }
  return local_20;
}

Assistant:

struct gpu_object *gpu_object_find(uint32_t cid, uint32_t handle)
{
	struct gpu_object *obj;
	for (obj = gpu_objects; obj != NULL; obj = obj->next)
		if (obj->cid == cid && obj->handle == handle)
			return obj;
	return NULL;
}